

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::StartXML(cmCTest *this,cmXMLWriter *xml,bool append)

{
  SystemInformation *this_00;
  ulong uVar1;
  ostream *this_01;
  char *pcVar2;
  allocator<char> local_509;
  string local_508;
  undefined1 local_4e8 [8];
  string changeId;
  size_t local_4c0;
  size_t local_4b8;
  uint local_4ac;
  uint local_4a8;
  int local_4a4;
  string local_4a0;
  string local_480;
  char *local_460;
  char *local_458;
  bool local_449;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0;
  allocator<char> local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [8];
  string site;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string stamp;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  string buildname;
  SystemInformation info;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  bool append_local;
  cmXMLWriter *xml_local;
  cmCTest *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    this_01 = std::operator<<((ostream *)local_198,
                              "Current Tag empty, this may mean NightlStartTime was not set correctly."
                             );
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x539,pcVar2,false);
    std::__cxx11::string::~string((string *)&info);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    cmSystemTools::SetFatalErrorOccured();
  }
  this_00 = (SystemInformation *)((long)&buildname.field_2 + 8);
  cmsys::SystemInformation::SystemInformation(this_00);
  cmsys::SystemInformation::RunCPUCheck(this_00);
  cmsys::SystemInformation::RunOSCheck((SystemInformation *)((long)&buildname.field_2 + 8));
  cmsys::SystemInformation::RunMemoryCheck((SystemInformation *)((long)&buildname.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"BuildName",(allocator<char> *)(stamp.field_2._M_local_buf + 0xf))
  ;
  GetCTestConfiguration(&local_210,this,&local_230);
  SafeBuildIdField((string *)local_1f0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)(stamp.field_2._M_local_buf + 0xf));
  std::operator+(&local_298,&this->CurrentTag,"-");
  GetTestModelString_abi_cxx11_((string *)((long)&site.field_2 + 8),this);
  std::operator+(&local_278,&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&site.field_2 + 8));
  SafeBuildIdField((string *)local_258,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(site.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Site",&local_319);
  GetCTestConfiguration(&local_2f8,this,&local_318);
  SafeBuildIdField((string *)local_2d8,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  cmXMLWriter::StartDocument(xml,"UTF-8");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"Site",&local_341);
  cmXMLWriter::StartElement(xml,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"BuildName",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
  cmXMLWriter::BreakAttributes(xml);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"BuildStamp",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"Name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"ctest-",&local_389);
  pcVar2 = cmVersion::GetCMakeVersion();
  std::operator+(&local_368,&local_388,pcVar2);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Generator",&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  if (append) {
    cmXMLWriter::Attribute<char[5]>(xml,"Append",(char (*) [5])0x8acd96);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Compiler",&local_3d1);
  GetCTestConfiguration(&local_3b0,this,&local_3d0);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"CompilerName",&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"CompilerVersion",&local_419);
  GetCTestConfiguration(&local_3f8,this,&local_418);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"CompilerVersion",&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  local_428 = cmsys::SystemInformation::GetOSName
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"OSName",&local_428);
  local_430 = cmsys::SystemInformation::GetHostname
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"Hostname",&local_430);
  local_438 = cmsys::SystemInformation::GetOSRelease
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"OSRelease",&local_438);
  local_440 = cmsys::SystemInformation::GetOSVersion
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"OSVersion",&local_440);
  local_448 = cmsys::SystemInformation::GetOSPlatform
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"OSPlatform",&local_448);
  local_449 = cmsys::SystemInformation::Is64Bits
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<bool>(xml,"Is64Bits",&local_449);
  local_458 = cmsys::SystemInformation::GetVendorString
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"VendorString",&local_458);
  local_460 = cmsys::SystemInformation::GetVendorID
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<char_const*>(xml,"VendorID",&local_460);
  cmsys::SystemInformation::GetFamilyID_abi_cxx11_
            (&local_480,(SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"FamilyID",&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  cmsys::SystemInformation::GetModelID_abi_cxx11_
            (&local_4a0,(SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"ModelID",&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  local_4a4 = cmsys::SystemInformation::GetProcessorCacheSize
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<int>(xml,"ProcessorCacheSize",&local_4a4);
  local_4a8 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<unsigned_int>(xml,"NumberOfLogicalCPU",&local_4a8);
  local_4ac = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<unsigned_int>(xml,"NumberOfPhysicalCPU",&local_4ac);
  local_4b8 = cmsys::SystemInformation::GetTotalVirtualMemory
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<unsigned_long>(xml,"TotalVirtualMemory",&local_4b8);
  local_4c0 = cmsys::SystemInformation::GetTotalPhysicalMemory
                        ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<unsigned_long>(xml,"TotalPhysicalMemory",&local_4c0);
  changeId.field_2._12_4_ =
       cmsys::SystemInformation::GetLogicalProcessorsPerPhysical
                 ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<unsigned_int>
            (xml,"LogicalProcessorsPerPhysical",(uint *)(changeId.field_2._M_local_buf + 0xc));
  changeId.field_2._8_4_ =
       cmsys::SystemInformation::GetProcessorClockFrequency
                 ((SystemInformation *)((long)&buildname.field_2 + 8));
  cmXMLWriter::Attribute<float>
            (xml,"ProcessorClockFrequency",(float *)((long)&changeId.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"ChangeId",&local_509);
  GetCTestConfiguration((string *)local_4e8,this,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>
              (xml,"ChangeId",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8);
  }
  AddSiteProperties(this,xml);
  std::__cxx11::string::~string((string *)local_4e8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_1f0);
  cmsys::SystemInformation::~SystemInformation((SystemInformation *)((long)&buildname.field_2 + 8));
  return;
}

Assistant:

void cmCTest::StartXML(cmXMLWriter& xml, bool append)
{
  if (this->CurrentTag.empty()) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Current Tag empty, this may mean"
               " NightlStartTime was not set correctly."
                 << std::endl);
    cmSystemTools::SetFatalErrorOccured();
  }

  // find out about the system
  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string buildname =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"));
  std::string stamp = cmCTest::SafeBuildIdField(this->CurrentTag + "-" +
                                                this->GetTestModelString());
  std::string site =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("Site"));

  xml.StartDocument();
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.BreakAttributes();
  xml.Attribute("BuildStamp", stamp);
  xml.Attribute("Name", site);
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  if (append) {
    xml.Attribute("Append", "true");
  }
  xml.Attribute("CompilerName", this->GetCTestConfiguration("Compiler"));
  xml.Attribute("CompilerVersion",
                this->GetCTestConfiguration("CompilerVersion"));
  xml.Attribute("OSName", info.GetOSName());
  xml.Attribute("Hostname", info.GetHostname());
  xml.Attribute("OSRelease", info.GetOSRelease());
  xml.Attribute("OSVersion", info.GetOSVersion());
  xml.Attribute("OSPlatform", info.GetOSPlatform());
  xml.Attribute("Is64Bits", info.Is64Bits());
  xml.Attribute("VendorString", info.GetVendorString());
  xml.Attribute("VendorID", info.GetVendorID());
  xml.Attribute("FamilyID", info.GetFamilyID());
  xml.Attribute("ModelID", info.GetModelID());
  xml.Attribute("ProcessorCacheSize", info.GetProcessorCacheSize());
  xml.Attribute("NumberOfLogicalCPU", info.GetNumberOfLogicalCPU());
  xml.Attribute("NumberOfPhysicalCPU", info.GetNumberOfPhysicalCPU());
  xml.Attribute("TotalVirtualMemory", info.GetTotalVirtualMemory());
  xml.Attribute("TotalPhysicalMemory", info.GetTotalPhysicalMemory());
  xml.Attribute("LogicalProcessorsPerPhysical",
                info.GetLogicalProcessorsPerPhysical());
  xml.Attribute("ProcessorClockFrequency", info.GetProcessorClockFrequency());

  std::string changeId = this->GetCTestConfiguration("ChangeId");
  if (!changeId.empty()) {
    xml.Attribute("ChangeId", changeId);
  }

  this->AddSiteProperties(xml);
}